

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall kj::Maybe<kj::Exception>::Maybe(Maybe<kj::Exception> *this,Exception *t)

{
  undefined8 uVar1;
  
  (this->ptr).isSet = true;
  (this->ptr).field_1.value.ownFile.content.ptr = (t->ownFile).content.ptr;
  (this->ptr).field_1.value.ownFile.content.size_ = (t->ownFile).content.size_;
  (this->ptr).field_1.value.ownFile.content.disposer = (t->ownFile).content.disposer;
  (t->ownFile).content.ptr = (char *)0x0;
  (t->ownFile).content.size_ = 0;
  uVar1 = *(undefined8 *)&t->line;
  (this->ptr).field_1.value.file = t->file;
  *(undefined8 *)((long)&(this->ptr).field_1 + 0x20) = uVar1;
  (this->ptr).field_1.value.description.content.ptr = (t->description).content.ptr;
  (this->ptr).field_1.value.description.content.size_ = (t->description).content.size_;
  (this->ptr).field_1.value.description.content.disposer = (t->description).content.disposer;
  (t->description).content.ptr = (char *)0x0;
  (t->description).content.size_ = 0;
  (this->ptr).field_1.value.context.ptr.disposer = (t->context).ptr.disposer;
  (this->ptr).field_1.value.context.ptr.ptr = (t->context).ptr.ptr;
  (t->context).ptr.ptr = (Context *)0x0;
  memcpy((void *)((long)&(this->ptr).field_1 + 0x50),t->trace,0x104);
  return;
}

Assistant:

inline NullableValue(T&& t)
      : isSet(true) {
    ctor(value, kj::mv(t));
  }